

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgvalue.c
# Opt level: O0

mg_value * mg_value_make_local_time(mg_local_time *local_time)

{
  mg_allocator *in_RDI;
  mg_value *value;
  size_t in_stack_ffffffffffffffe8;
  mg_value *local_8;
  
  local_8 = (mg_value *)mg_allocator_malloc(in_RDI,in_stack_ffffffffffffffe8);
  if (local_8 == (mg_value *)0x0) {
    local_8 = (mg_value *)0x0;
  }
  else {
    local_8->type = MG_VALUE_TYPE_LOCAL_TIME;
    (local_8->field_1).string_v = (mg_string *)in_RDI;
  }
  return local_8;
}

Assistant:

mg_value *mg_value_make_local_time(mg_local_time *local_time) {
  mg_value *value = mg_allocator_malloc(&mg_system_allocator, sizeof(mg_value));
  if (!value) {
    return NULL;
  }
  value->type = MG_VALUE_TYPE_LOCAL_TIME;
  value->local_time_v = local_time;
  return value;
}